

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDLNodeTest.cpp
# Opt level: O1

void __thiscall
ODDLParser::DDLNodeTest_accessPropertiesDDLNodeTest_Test::
~DDLNodeTest_accessPropertiesDDLNodeTest_Test(DDLNodeTest_accessPropertiesDDLNodeTest_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(DDLNodeTest, accessPropertiesDDLNodeTest) {
    DDLNode *node = DDLNode::create("test", "testName");
    ASSERT_TRUE(nullptr != node);
    EXPECT_EQ(nullptr, node->getProperties());
    Text *id = new Text("test", 4);
    Property *first = new Property(id);
    node->setProperties(first);
    EXPECT_EQ(first, node->getProperties());
    delete node;
}